

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

QByteArray * QFileSystemEngine::id(int fd)

{
  int iVar1;
  int in_ESI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QByteArray *result;
  stat64 statResult;
  undefined7 in_stack_ffffffffffffff08;
  char in_stack_ffffffffffffff0f;
  QByteArray *n;
  stat64 local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RDI;
  memset(&local_98,0xaa,0x90);
  iVar1 = fstat64(in_ESI,&local_98);
  if (iVar1 == 0) {
    (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
    (in_RDI->d).size = -0x5555555555555556;
    QByteArray::number((qulonglong)n,(int)((ulong)in_RDI >> 0x20));
    QByteArray::operator+=(in_RDI,in_stack_ffffffffffffff0f);
    QByteArray::number((qulonglong)n,(int)((ulong)in_RDI >> 0x20));
    QByteArray::operator+=
              (in_RDI,(QByteArray *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    QByteArray::~QByteArray((QByteArray *)0x16cf1a);
  }
  else {
    QByteArray::QByteArray((QByteArray *)0x16cea0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return n;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QFileSystemEngine::id(int fd)
{
    QT_STATBUF statResult;
    if (QT_FSTAT(fd, &statResult)) {
        qErrnoWarning("fstat() failed for fd %d", fd);
        return QByteArray();
    }
    QByteArray result = QByteArray::number(quint64(statResult.st_dev), 16);
    result += ':';
    result += QByteArray::number(quint64(statResult.st_ino));
    return result;
}